

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O3

_ValAtom * __thiscall mbc::Val::Person::attr(Person *this,string *attribute)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)attribute);
  if (iVar1 == 0) {
    lVar3 = 0x30;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)attribute);
    if (iVar1 == 0) {
      lVar3 = 0x38;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)attribute);
      if (iVar1 == 0) {
        lVar3 = 0x40;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)attribute);
        if (iVar1 == 0) {
          lVar3 = 0x60;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)attribute);
          if (iVar1 == 0) {
            lVar3 = 0x48;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)attribute);
            if (iVar1 == 0) {
              lVar3 = 0x50;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)attribute);
              if (iVar1 == 0) {
                lVar3 = 0x58;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)attribute);
                lVar3 = 0x68;
                if (iVar1 != 0) {
                  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar2 = &PTR__exception_0013f898;
                  __cxa_throw(puVar2,&bad_attr::typeinfo,std::exception::~exception);
                }
              }
            }
          }
        }
      }
    }
  }
  return *(_ValAtom **)((long)&(this->super_ValBase)._vptr_ValBase + lVar3);
}

Assistant:

_ValAtom* Person::attr(string attribute) {
    if(attribute == "name")             return name_;
    if(attribute == "sex")              return sex_;
    if(attribute == "telephone")        return telephone_;
    if(attribute == "location")         return location_;
    if(attribute == "mail_number")      return mail_number_;
    if(attribute == "email")            return email_;
    if(attribute == "qq_number")        return qq_number_;
    if(attribute == "classes")          return classes_;

    throw bad_attr();
}